

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mutexes.c
# Opt level: O2

int run_test_thread_mutex(void)

{
  int iVar1;
  uv_mutex_t mutex;
  
  iVar1 = uv_mutex_init(&mutex);
  if (iVar1 == 0) {
    uv_mutex_lock(&mutex);
    uv_mutex_unlock(&mutex);
    uv_mutex_destroy(&mutex);
    return 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-mutexes.c"
          ,0x2b,"r == 0");
  abort();
}

Assistant:

TEST_IMPL(thread_mutex) {
  uv_mutex_t mutex;
  int r;

  r = uv_mutex_init(&mutex);
  ASSERT(r == 0);

  uv_mutex_lock(&mutex);
  uv_mutex_unlock(&mutex);
  uv_mutex_destroy(&mutex);

  return 0;
}